

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void __thiscall vkt::sr::anon_unknown_0::ShaderMatrixCase::setupShader(ShaderMatrixCase *this)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  DataType dataType;
  DataType dataType_00;
  MatrixOp op;
  byte bVar4;
  byte bVar5;
  int row_3;
  OperationType OVar6;
  int iVar7;
  DataType DVar8;
  int iVar9;
  char *pcVar10;
  ostream *poVar11;
  size_t sVar12;
  undefined8 *puVar13;
  long *plVar14;
  float *pfVar15;
  undefined4 *puVar16;
  char **ppcVar17;
  ostream *poVar18;
  size_type *psVar19;
  string *psVar20;
  ShaderMatrixCase *pSVar21;
  int row;
  int precision;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  char *pcVar22;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 extraout_RDX_15;
  undefined8 extraout_RDX_16;
  undefined8 extraout_RDX_17;
  undefined8 extraout_RDX_18;
  undefined8 extraout_RDX_19;
  undefined8 uVar23;
  undefined8 extraout_RDX_20;
  undefined8 extraout_RDX_21;
  undefined8 extraout_RDX_22;
  undefined8 extraout_RDX_23;
  undefined8 extraout_RDX_24;
  undefined8 extraout_RDX_25;
  undefined8 extraout_RDX_26;
  undefined8 extraout_RDX_27;
  undefined8 extraout_RDX_28;
  string *psVar24;
  undefined8 extraout_RDX_29;
  undefined8 extraout_RDX_30;
  undefined8 extraout_RDX_31;
  undefined8 extraout_RDX_32;
  undefined8 extraout_RDX_33;
  undefined8 extraout_RDX_34;
  bool bVar25;
  int colNdx_3;
  string *psVar26;
  long lVar27;
  string *psVar28;
  ulong uVar29;
  bool bVar30;
  int rowNdx;
  int colNdx;
  long lVar31;
  pointer pbVar32;
  ostringstream *this_00;
  long lVar33;
  bool bVar34;
  DataType resultType;
  string operationValue0;
  ostringstream s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passVars;
  string inValue0;
  string inValue1;
  string operationValue1;
  ostringstream vtx;
  ostringstream frag;
  undefined1 local_648 [12];
  DataType local_63c;
  string local_638;
  ShaderMatrixCase *local_610;
  char *local_608;
  Precision local_5fc;
  char *local_5f8;
  ostream *local_5f0;
  ulong *local_5e8;
  long local_5e0;
  ulong local_5d8 [2];
  long local_5c8;
  ulong local_5c0;
  ulong *local_5b8;
  long local_5b0;
  ulong local_5a8 [2];
  int local_594;
  string *local_590;
  char *local_588;
  char *local_580;
  char local_578;
  undefined7 uStack_577;
  string local_568;
  ulong local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  ios_base local_4f8 [272];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3e8;
  undefined4 *local_3d0;
  undefined4 *local_3c8;
  undefined4 *local_3c0;
  undefined4 *local_3b8;
  undefined4 *local_3b0;
  undefined4 *local_3a8;
  undefined4 *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  long local_380;
  char local_378;
  undefined7 uStack_377;
  char *local_368;
  undefined8 local_360;
  char local_358;
  undefined7 uStack_357;
  char *local_348;
  undefined8 local_340;
  char local_338;
  undefined7 uStack_337;
  ulong local_328;
  long local_320 [14];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  this_00 = local_1a8;
  if ((this->super_ShaderRenderCase).m_isVertexCase != false) {
    this_00 = (ostringstream *)local_320;
  }
  dataType = (this->m_in0).dataType;
  dataType_00 = (this->m_in1).dataType;
  local_388 = &local_378;
  local_380 = 0;
  local_378 = '\0';
  local_368 = &local_358;
  local_360 = 0;
  local_358 = '\0';
  local_63c = TYPE_LAST;
  local_5fc = (this->m_in0).precision;
  local_3e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  op = this->m_op;
  local_610 = this;
  OVar6 = MatrixCaseUtils::getOperationType(op);
  lVar33 = 1;
  if (OVar6 < OPERATIONTYPE_LAST) {
    lVar33 = *(long *)(&DAT_00b1fc30 + (ulong)OVar6 * 8);
  }
  uVar1 = dataType_00 - TYPE_FLOAT_MAT2;
  uVar2 = dataType_00 - TYPE_DOUBLE_MAT2;
  local_588 = &local_578;
  local_580 = (char *)0x0;
  local_578 = '\0';
  local_348 = &local_338;
  local_340 = 0;
  local_338 = '\0';
  DVar8 = dataType;
  switch(op) {
  case OP_MUL:
    if ((8 < dataType - TYPE_FLOAT_MAT2 && 8 < dataType - TYPE_DOUBLE_MAT2) ||
       (8 < uVar1 && 8 < uVar2)) goto switchD_005ad88f_caseD_3;
    iVar9 = glu::getDataTypeMatrixNumColumns(dataType_00);
    iVar7 = glu::getDataTypeMatrixNumRows((local_610->m_in0).dataType);
    DVar8 = glu::getDataTypeMatrix(iVar9,iVar7);
    break;
  default:
switchD_005ad88f_caseD_3:
    if ((OVar6 & ~OPERATIONTYPE_BINARY_FUNCTION) == OPERATIONTYPE_UNARY_PREFIX_OPERATOR)
    goto switchD_005ad88f_caseD_7;
    if (dataType - TYPE_FLOAT_MAT2 < 9 || dataType - TYPE_DOUBLE_MAT2 < 9) {
      if (uVar1 < 9 || uVar2 < 9) goto switchD_005ad88f_caseD_7;
      if (dataType_00 != TYPE_FLOAT) {
        iVar9 = glu::getDataTypeMatrixNumRows(dataType);
        goto LAB_005ad98d;
      }
    }
    else {
      DVar8 = local_63c;
      if ((uVar1 < 9 || uVar2 < 9) && (DVar8 = dataType_00, dataType != TYPE_FLOAT)) {
        iVar9 = glu::getDataTypeMatrixNumColumns(dataType_00);
LAB_005ad98d:
        DVar8 = glu::getDataTypeFloatVec(iVar9);
      }
    }
    break;
  case OP_OUTER_PRODUCT:
    iVar9 = glu::getDataTypeScalarSize(dataType_00);
    iVar7 = glu::getDataTypeScalarSize((local_610->m_in0).dataType);
    DVar8 = glu::getDataTypeMatrix(iVar9,iVar7);
    break;
  case OP_TRANSPOSE:
    iVar9 = glu::getDataTypeMatrixNumRows(dataType);
    iVar7 = glu::getDataTypeMatrixNumColumns((local_610->m_in0).dataType);
    DVar8 = glu::getDataTypeMatrix(iVar9,iVar7);
    break;
  case OP_INVERSE:
switchD_005ad88f_caseD_7:
    break;
  case OP_DETERMINANT:
    local_63c = TYPE_FLOAT;
    DVar8 = local_63c;
  }
  local_63c = DVar8;
  local_5c8 = lVar33;
  if ((sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::
                                   header_abi_cxx11_), iVar9 != 0)) {
    sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_._M_dataplus._M_p =
         (pointer)&sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_.
                   field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_,
               "#version 310 es\n","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::
                         header_abi_cxx11_);
    lVar33 = local_5c8;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,
             sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_.
             _M_dataplus._M_p,
             sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_.
             _M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_.
             _M_dataplus._M_p,
             sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_.
             _M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"layout(location = 0) in highp vec4 a_position;\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out mediump vec4 dEQP_FragColor;\n",0x36);
  if ((local_610->super_ShaderRenderCase).m_isVertexCase == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"layout(location = 0) out mediump vec4 v_color;\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) in mediump vec4 v_color;\n",0x2e);
  }
  local_608 = (char *)0x0;
  local_3a0 = &sr::(anonymous_namespace)::s_constInMat4x4;
  local_3a8 = &sr::(anonymous_namespace)::s_constInMat4x3;
  local_3b0 = &sr::(anonymous_namespace)::s_constInMat4x2;
  local_3b8 = &sr::(anonymous_namespace)::s_constInMat3x4;
  local_3c0 = &sr::(anonymous_namespace)::s_constInMat3x3;
  local_3c8 = &sr::(anonymous_namespace)::s_constInMat3x2;
  local_3d0 = &DAT_00b1f8b4;
  local_390 = sr::(anonymous_namespace)::s_constInVec3;
  local_398 = sr::(anonymous_namespace)::s_constInVec4;
  local_594 = 0;
  local_5c0 = 0;
  do {
    pSVar21 = local_610;
    lVar31 = 0xec;
    if (local_608 == (char *)0x0) {
      lVar31 = 0xe0;
    }
    pcVar10 = glu::getPrecisionName
                        (*(Precision *)
                          ((long)&(local_610->super_ShaderRenderCase).super_TestCase.super_TestCase.
                                  super_TestNode.m_testCtx + lVar31));
    local_5f8 = glu::getDataTypeName
                          (*(DataType *)
                            ((long)&(pSVar21->super_ShaderRenderCase).super_TestCase.super_TestCase.
                                    super_TestNode._vptr_TestNode + lVar31 + 4));
    local_590 = (string *)&local_368;
    if (local_608 == (char *)0x0) {
      local_590 = (string *)&local_388;
    }
    iVar9 = *(int *)((long)&(pSVar21->super_ShaderRenderCase).super_TestCase.super_TestCase.
                            super_TestNode._vptr_TestNode + lVar31);
    iVar7 = (int)this_00;
    if (iVar9 != 0) {
      if (iVar9 == 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"layout(std140, set = 0, binding = ",0x22);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,") uniform buffer",0x10);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)local_608);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," { ",3);
        if (pcVar10 == (char *)0x0) {
          std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
        }
        else {
          sVar12 = strlen(pcVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar10,sVar12);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
        pcVar10 = local_5f8;
        if (local_5f8 == (char *)0x0) {
          std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
        }
        else {
          sVar12 = strlen(local_5f8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar10,sVar12);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," u_in",5);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)local_608);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"; };\n",5);
        local_5e8 = local_5d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"u_in","");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_568);
        std::ostream::operator<<(&local_568,(int)local_608);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_568);
        std::ios_base::~ios_base(local_4f8);
        uVar29 = 0xf;
        if (local_5e8 != local_5d8) {
          uVar29 = local_5d8[0];
        }
        if (uVar29 < (ulong)(local_5b0 + local_5e0)) {
          uVar29 = 0xf;
          if (local_5b8 != local_5a8) {
            uVar29 = local_5a8[0];
          }
          if (uVar29 < (ulong)(local_5b0 + local_5e0)) goto LAB_005adf94;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_5b8,0,(char *)0x0,(ulong)local_5e8);
        }
        else {
LAB_005adf94:
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_5e8,(ulong)local_5b8);
        }
        local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
        psVar19 = puVar13 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar19) {
          local_638.field_2._M_allocated_capacity = *psVar19;
          local_638.field_2._8_8_ = puVar13[3];
        }
        else {
          local_638.field_2._M_allocated_capacity = *psVar19;
          local_638._M_dataplus._M_p = (pointer)*puVar13;
        }
        local_638._M_string_length = puVar13[1];
        *puVar13 = psVar19;
        puVar13[1] = 0;
        *(undefined1 *)psVar19 = 0;
        std::__cxx11::string::operator=(local_590,(string *)&local_638);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_638._M_dataplus._M_p != &local_638.field_2) {
          operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
        }
        if (local_5b8 != local_5a8) {
          operator_delete(local_5b8,local_5a8[0] + 1);
        }
        if (local_5e8 != local_5d8) {
          operator_delete(local_5e8,local_5d8[0] + 1);
        }
        local_594 = local_594 + 1;
      }
      else if (iVar9 == 2) {
        iVar9 = *(int *)((long)&(local_610->super_ShaderRenderCase).super_TestCase.super_TestCase.
                                super_TestNode._vptr_TestNode + lVar31 + 4);
        if (iVar9 - 5U < 9 || iVar9 - 0x12U < 9) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320,"layout(location = ",0x12);
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_320);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,") in ",5);
          if (pcVar10 == (char *)0x0) {
            std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
          }
          else {
            sVar12 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar10,sVar12);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
          pcVar22 = local_5f8;
          if (local_5f8 == (char *)0x0) {
            std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
          }
          else {
            sVar12 = strlen(local_5f8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar22,sVar12);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," a_",3);
          pcVar22 = local_5f8;
          if (local_5f8 == (char *)0x0) {
            std::ios::clear((int)local_648 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x328);
          }
          else {
            sVar12 = strlen(local_5f8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar22,sVar12);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,";\n",2);
          bVar5 = 1;
          if ((local_610->super_ShaderRenderCase).m_isVertexCase == false) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,"layout(location = ",0x12);
            local_328 = (ulong)((int)local_608 + (int)local_5c0 + 1);
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_320);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,") out ",6);
            local_5f0 = poVar11;
            if (pcVar10 == (char *)0x0) {
              std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
            }
            else {
              sVar12 = strlen(pcVar10);
              poVar11 = local_5f0;
              std::__ostream_insert<char,std::char_traits<char>>(local_5f0,pcVar10,sVar12);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
            poVar11 = local_5f0;
            pcVar22 = local_5f8;
            if (local_5f8 == (char *)0x0) {
              std::ios::clear((int)local_5f0 + (int)*(undefined8 *)(*(long *)local_5f0 + -0x18));
            }
            else {
              sVar12 = strlen(local_5f8);
              poVar11 = local_5f0;
              std::__ostream_insert<char,std::char_traits<char>>(local_5f0,pcVar22,sVar12);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," v_",3);
            poVar11 = local_5f0;
            pcVar22 = local_5f8;
            if (local_5f8 == (char *)0x0) {
              std::ios::clear((int)local_5f0 + (int)*(undefined8 *)(*(long *)local_5f0 + -0x18));
            }
            else {
              sVar12 = strlen(local_5f8);
              poVar11 = local_5f0;
              std::__ostream_insert<char,std::char_traits<char>>(local_5f0,pcVar22,sVar12);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,";\n",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"layout(location = ",0x12);
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,") in ",5);
            iVar9 = (int)poVar11;
            if (pcVar10 == (char *)0x0) {
              std::ios::clear(iVar9 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
            }
            else {
              sVar12 = strlen(pcVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar10,sVar12);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
            pcVar10 = local_5f8;
            if (local_5f8 == (char *)0x0) {
              std::ios::clear(iVar9 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
            }
            else {
              sVar12 = strlen(local_5f8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar10,sVar12);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," v_",3);
            pcVar10 = local_5f8;
            if (local_5f8 == (char *)0x0) {
              std::ios::clear(iVar9 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
            }
            else {
              sVar12 = strlen(local_5f8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar10,sVar12);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,";\n",2);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_568,local_5f8,(allocator<char> *)&local_638);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_3e8,&local_568);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_568._M_dataplus._M_p != &local_568.field_2) {
              operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1
                             );
            }
            bVar5 = (local_610->super_ShaderRenderCase).m_isVertexCase;
          }
          bVar34 = (bVar5 & 1) != 0;
          pcVar10 = "v_";
          if (bVar34) {
            pcVar10 = "a_";
          }
          local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
          pcVar22 = "";
          if (bVar34) {
            pcVar22 = "";
          }
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,pcVar10,pcVar22);
          glu::getDataTypeName
                    (*(DataType *)
                      ((long)&(local_610->super_ShaderRenderCase).super_TestCase.super_TestCase.
                              super_TestNode._vptr_TestNode + lVar31 + 4));
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_638);
          psVar19 = (size_type *)(plVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar19) {
            local_568.field_2._M_allocated_capacity = *psVar19;
            local_568.field_2._8_8_ = plVar14[3];
            local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
          }
          else {
            local_568.field_2._M_allocated_capacity = *psVar19;
            local_568._M_dataplus._M_p = (pointer)*plVar14;
          }
          local_568._M_string_length = plVar14[1];
          *plVar14 = (long)psVar19;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          std::__cxx11::string::operator=(local_590,(string *)&local_568);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_568._M_dataplus._M_p != &local_568.field_2) {
            operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_638._M_dataplus._M_p != &local_638.field_2) {
            operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
          }
          iVar9 = glu::getDataTypeMatrixNumColumns
                            (*(DataType *)
                              ((long)&(local_610->super_ShaderRenderCase).super_TestCase.
                                      super_TestCase.super_TestNode._vptr_TestNode + lVar31 + 4));
          local_5c0 = (ulong)(uint)(iVar9 + (int)local_5c0);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320,"layout(location = 1) in ",0x18);
          if (pcVar10 == (char *)0x0) {
            std::ios::clear((int)local_648 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x328);
          }
          else {
            sVar12 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar10,sVar12);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
          pcVar22 = local_5f8;
          if (local_5f8 == (char *)0x0) {
            std::ios::clear((int)local_648 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x328);
          }
          else {
            sVar12 = strlen(local_5f8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar22,sVar12);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320," a_coords;\n",0xb);
          pcVar22 = "a_coords";
          if ((local_610->super_ShaderRenderCase).m_isVertexCase == false) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,"layout(location = ",0x12);
            local_5f0 = (ostream *)(ulong)((int)local_5c0 + 1);
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_320);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,") out ",6);
            if (pcVar10 == (char *)0x0) {
              std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
            }
            else {
              sVar12 = strlen(pcVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar10,sVar12);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
            pcVar22 = local_5f8;
            if (local_5f8 == (char *)0x0) {
              std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
            }
            else {
              sVar12 = strlen(local_5f8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar22,sVar12);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," v_coords;\n",0xb);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"layout(location = ",0x12);
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,") in ",5);
            if (pcVar10 == (char *)0x0) {
              std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
            }
            else {
              sVar12 = strlen(pcVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar10,sVar12);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
            pcVar10 = local_5f8;
            if (local_5f8 == (char *)0x0) {
              std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
            }
            else {
              sVar12 = strlen(local_5f8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar10,sVar12);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," v_coords;\n",0xb);
            local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"coords","");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_3e8,&local_568);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_568._M_dataplus._M_p != &local_568.field_2) {
              operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1
                             );
            }
            pcVar22 = "v_coords";
            if (((local_610->super_ShaderRenderCase).m_isVertexCase & 1U) != 0) {
              pcVar22 = "a_coords";
            }
          }
          ppcVar17 = &local_368;
          if (local_608 == (char *)0x0) {
            ppcVar17 = &local_388;
          }
          std::__cxx11::string::_M_replace((ulong)local_590,0,ppcVar17[1],(ulong)pcVar22);
        }
      }
      goto LAB_005af78f;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"const ",6);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar12 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar10,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    pcVar10 = local_5f8;
    if (local_5f8 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar12 = strlen(local_5f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar10,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," in",3);
    poVar11 = (ostream *)std::ostream::operator<<(this_00,(int)local_608);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," = ",3);
    switch(*(undefined4 *)
            ((long)&(local_610->super_ShaderRenderCase).super_TestCase.super_TestCase.super_TestNode
                    ._vptr_TestNode + lVar31 + 4)) {
    case 1:
      de::floatToString_abi_cxx11_
                (&local_568,(de *)&DAT_00000001,
                 *(float *)((long)&sr::(anonymous_namespace)::s_constInFloat + (long)local_608 * 4),
                 precision);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,local_568._M_dataplus._M_p,local_568._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_568._M_dataplus._M_p != &local_568.field_2) {
        operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
      }
      break;
    case 2:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"vec",3);
      poVar11 = (ostream *)std::ostream::operator<<(this_00,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"(",1);
      lVar33 = (long)local_608 * 8;
      uVar23 = extraout_RDX_20;
      bVar34 = true;
      do {
        bVar25 = bVar34;
        iVar9 = (int)uVar23;
        pfVar15 = (float *)(sr::(anonymous_namespace)::s_constInVec2 + lVar33);
        if (!bVar25) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          pfVar15 = (float *)(sr::(anonymous_namespace)::s_constInVec2 + lVar33 + 4);
          iVar9 = extraout_EDX_06;
        }
        de::floatToString_abi_cxx11_(&local_568,(de *)&DAT_00000001,*pfVar15,iVar9);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,local_568._M_dataplus._M_p,local_568._M_string_length);
        uVar23 = extraout_RDX_21;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_568._M_dataplus._M_p != &local_568.field_2) {
          operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
          uVar23 = extraout_RDX_22;
        }
        bVar34 = false;
      } while (bVar25);
      goto LAB_005af1c3;
    case 3:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"vec",3);
      poVar11 = (ostream *)std::ostream::operator<<(this_00,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"(",1);
      lVar33 = (long)local_608 * 0xc;
      lVar31 = 0;
      uVar23 = extraout_RDX_11;
      do {
        iVar9 = (int)uVar23;
        pfVar15 = (float *)(sr::(anonymous_namespace)::s_constInVec3 + lVar33);
        if (lVar31 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          pfVar15 = (float *)(local_390 + lVar31);
          iVar9 = extraout_EDX_03;
        }
        de::floatToString_abi_cxx11_(&local_568,(de *)&DAT_00000001,*pfVar15,iVar9);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,local_568._M_dataplus._M_p,local_568._M_string_length);
        uVar23 = extraout_RDX_12;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_568._M_dataplus._M_p != &local_568.field_2) {
          operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
          uVar23 = extraout_RDX_13;
        }
        lVar31 = lVar31 + 4;
      } while (lVar31 != 0xc);
      goto LAB_005af1c3;
    case 4:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"vec",3);
      poVar11 = (ostream *)std::ostream::operator<<(this_00,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"(",1);
      lVar33 = (long)local_608 * 0x10;
      lVar31 = 0;
      uVar23 = extraout_RDX_14;
      do {
        iVar9 = (int)uVar23;
        pfVar15 = (float *)(sr::(anonymous_namespace)::s_constInVec4 + lVar33);
        if (lVar31 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          pfVar15 = (float *)(local_398 + lVar31);
          iVar9 = extraout_EDX_04;
        }
        de::floatToString_abi_cxx11_(&local_568,(de *)&DAT_00000001,*pfVar15,iVar9);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,local_568._M_dataplus._M_p,local_568._M_string_length);
        uVar23 = extraout_RDX_15;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_568._M_dataplus._M_p != &local_568.field_2) {
          operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
          uVar23 = extraout_RDX_16;
        }
        lVar31 = lVar31 + 4;
      } while (lVar31 != 0x10);
LAB_005af1c3:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
      lVar33 = local_5c8;
      break;
    case 5:
      lVar33 = (long)local_608 * 0x10;
      local_638._M_dataplus._M_p._4_4_ =
           *(undefined4 *)(sr::(anonymous_namespace)::s_constInMat2x2 + lVar33 + 8);
      local_638._M_dataplus._M_p._0_4_ =
           *(undefined4 *)(sr::(anonymous_namespace)::s_constInMat2x2 + lVar33);
      local_638._M_string_length =
           CONCAT44(*(undefined4 *)(sr::(anonymous_namespace)::s_constInMat2x2 + lVar33 + 0xc),
                    *(undefined4 *)(sr::(anonymous_namespace)::s_constInMat2x2 + lVar33 + 4));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"mat",3);
      std::ostream::operator<<(this_00,2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
      bVar5 = 0;
      psVar24 = &local_638;
      uVar23 = extraout_RDX_02;
      bVar34 = true;
      do {
        bVar25 = bVar34;
        bVar4 = 0;
        lVar33 = 0;
        bVar34 = true;
        do {
          bVar30 = bVar34;
          iVar9 = (int)uVar23;
          if ((bool)(bVar4 | bVar5)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            iVar9 = extraout_EDX_00;
          }
          de::floatToString_abi_cxx11_
                    (&local_568,(de *)&DAT_00000001,
                     *(float *)((long)&(psVar24->_M_dataplus)._M_p + lVar33 * 4),iVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,local_568._M_dataplus._M_p,local_568._M_string_length);
          uVar23 = extraout_RDX_03;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_568._M_dataplus._M_p != &local_568.field_2) {
            operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
            uVar23 = extraout_RDX_04;
          }
          lVar33 = 1;
          bVar4 = 1;
          bVar34 = false;
        } while (bVar30);
        bVar5 = 1;
        psVar24 = (string *)&local_638._M_string_length;
        bVar34 = false;
      } while (bVar25);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
      lVar33 = local_5c8;
      break;
    case 6:
      local_638._M_dataplus._M_p = (pointer)0x0;
      local_638._M_string_length = 0;
      local_638.field_2._M_allocated_capacity = 0;
      lVar33 = 0;
      do {
        uVar3 = local_3d0[lVar33 * 2];
        *(undefined4 *)((long)&local_638._M_dataplus._M_p + lVar33 * 4) = local_3d0[lVar33 * 2 + -1]
        ;
        *(undefined4 *)((long)&local_638._M_string_length + lVar33 * 4 + 4U) = uVar3;
        lVar33 = lVar33 + 1;
      } while (lVar33 != 3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"mat",3);
      poVar11 = (ostream *)std::ostream::operator<<(this_00,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"x",1);
      std::ostream::operator<<(poVar11,3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
      bVar5 = 0;
      psVar24 = &local_638;
      uVar23 = extraout_RDX_23;
      bVar34 = true;
      do {
        bVar25 = bVar34;
        lVar33 = 0;
        do {
          iVar9 = (int)uVar23;
          if (!(bool)(~bVar5 & lVar33 == 0)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            iVar9 = extraout_EDX_07;
          }
          de::floatToString_abi_cxx11_
                    (&local_568,(de *)&DAT_00000001,
                     *(float *)((long)&(psVar24->_M_dataplus)._M_p + lVar33 * 4),iVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,local_568._M_dataplus._M_p,local_568._M_string_length);
          uVar23 = extraout_RDX_24;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_568._M_dataplus._M_p != &local_568.field_2) {
            operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
            uVar23 = extraout_RDX_25;
          }
          lVar33 = lVar33 + 1;
        } while (lVar33 != 3);
        bVar5 = 1;
        psVar24 = (string *)((long)&local_638._M_string_length + 4);
        bVar34 = false;
      } while (bVar25);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
      lVar33 = local_5c8;
      break;
    case 7:
      lVar33 = (long)local_608 * 0x20;
      local_638._M_dataplus._M_p._4_4_ =
           *(undefined4 *)(sr::(anonymous_namespace)::s_constInMat2x4 + lVar33 + 8);
      local_638._M_dataplus._M_p._0_4_ =
           *(undefined4 *)(sr::(anonymous_namespace)::s_constInMat2x4 + lVar33);
      local_638._M_string_length =
           CONCAT44(*(undefined4 *)(sr::(anonymous_namespace)::s_constInMat2x4 + lVar33 + 0x18),
                    *(undefined4 *)(sr::(anonymous_namespace)::s_constInMat2x4 + lVar33 + 0x10));
      local_638.field_2._M_allocated_capacity._4_4_ =
           *(undefined4 *)(sr::(anonymous_namespace)::s_constInMat2x4 + lVar33 + 0xc);
      local_638.field_2._M_allocated_capacity._0_4_ =
           *(undefined4 *)(sr::(anonymous_namespace)::s_constInMat2x4 + lVar33 + 4);
      local_638.field_2._12_4_ =
           *(undefined4 *)(sr::(anonymous_namespace)::s_constInMat2x4 + lVar33 + 0x1c);
      local_638.field_2._8_4_ =
           *(undefined4 *)(sr::(anonymous_namespace)::s_constInMat2x4 + lVar33 + 0x14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"mat",3);
      poVar11 = (ostream *)std::ostream::operator<<(this_00,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"x",1);
      std::ostream::operator<<(poVar11,4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
      bVar5 = 0;
      psVar24 = &local_638;
      uVar23 = extraout_RDX_26;
      bVar34 = true;
      do {
        bVar25 = bVar34;
        lVar33 = 0;
        do {
          iVar9 = (int)uVar23;
          if (!(bool)(~bVar5 & lVar33 == 0)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            iVar9 = extraout_EDX_08;
          }
          de::floatToString_abi_cxx11_
                    (&local_568,(de *)&DAT_00000001,
                     *(float *)((long)&(psVar24->_M_dataplus)._M_p + lVar33 * 4),iVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,local_568._M_dataplus._M_p,local_568._M_string_length);
          uVar23 = extraout_RDX_27;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_568._M_dataplus._M_p != &local_568.field_2) {
            operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
            uVar23 = extraout_RDX_28;
          }
          lVar33 = lVar33 + 1;
        } while (lVar33 != 4);
        bVar5 = 1;
        psVar24 = (string *)&local_638.field_2;
        bVar34 = false;
      } while (bVar25);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
      lVar33 = local_5c8;
      break;
    case 8:
      local_638._M_dataplus._M_p = (pointer)0x0;
      local_638._M_string_length = 0;
      local_638.field_2._M_allocated_capacity = 0;
      lVar33 = 0;
      psVar24 = &local_638;
      bVar34 = true;
      do {
        bVar25 = bVar34;
        lVar31 = 0;
        do {
          *(undefined4 *)&(&psVar24->_M_dataplus)[lVar31]._M_p =
               *(undefined4 *)((long)local_3c8 + lVar31 * 4 + lVar33);
          lVar31 = lVar31 + 1;
        } while (lVar31 != 3);
        lVar33 = 0xc;
        psVar24 = (string *)((long)&local_638._M_dataplus._M_p + 4);
        bVar34 = false;
      } while (bVar25);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"mat",3);
      poVar11 = (ostream *)std::ostream::operator<<(this_00,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"x",1);
      std::ostream::operator<<(poVar11,2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
      lVar33 = 0;
      uVar23 = extraout_RDX_17;
      do {
        bVar5 = 0;
        lVar31 = 0;
        bVar34 = true;
        do {
          bVar25 = bVar34;
          iVar9 = (int)uVar23;
          if (!(bool)(lVar33 == 0 & (bVar5 ^ 1))) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            iVar9 = extraout_EDX_05;
          }
          de::floatToString_abi_cxx11_
                    (&local_568,(de *)&DAT_00000001,
                     *(float *)((long)(&local_638._M_dataplus + lVar33) + lVar31 * 4),iVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,local_568._M_dataplus._M_p,local_568._M_string_length);
          uVar23 = extraout_RDX_18;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_568._M_dataplus._M_p != &local_568.field_2) {
            operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
            uVar23 = extraout_RDX_19;
          }
          lVar31 = 1;
          bVar5 = 1;
          bVar34 = false;
        } while (bVar25);
        lVar33 = lVar33 + 1;
      } while (lVar33 != 3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
      lVar33 = local_5c8;
      break;
    case 9:
      local_568.field_2._M_allocated_capacity = 0;
      local_568.field_2._8_8_ = 0;
      local_568._M_dataplus._M_p = (pointer)0x0;
      local_568._M_string_length = 0;
      local_548 = local_548 & 0xffffffff00000000;
      psVar24 = &local_568;
      lVar31 = 0;
      puVar16 = local_3c0;
      psVar20 = psVar24;
      do {
        lVar27 = 0;
        psVar28 = psVar20;
        do {
          *(undefined4 *)&(psVar28->_M_dataplus)._M_p = puVar16[lVar27];
          lVar27 = lVar27 + 1;
          psVar28 = (string *)((long)&psVar28->_M_string_length + 4);
        } while (lVar27 != 3);
        lVar31 = lVar31 + 1;
        psVar20 = (string *)((long)&(psVar20->_M_dataplus)._M_p + 4);
        puVar16 = puVar16 + 3;
      } while (lVar31 != 3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"mat",3);
      std::ostream::operator<<(this_00,3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
      lVar31 = 0;
      uVar23 = extraout_RDX_32;
      do {
        lVar27 = 0;
        do {
          iVar9 = (int)uVar23;
          if ((int)lVar27 != 0 || (int)lVar31 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            iVar9 = extraout_EDX_10;
          }
          de::floatToString_abi_cxx11_
                    (&local_638,(de *)&DAT_00000001,
                     *(float *)((long)&(psVar24->_M_dataplus)._M_p + lVar27 * 4),iVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,local_638._M_dataplus._M_p,local_638._M_string_length);
          uVar23 = extraout_RDX_33;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_638._M_dataplus._M_p != &local_638.field_2) {
            operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
            uVar23 = extraout_RDX_34;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 != 3);
        lVar31 = lVar31 + 1;
        psVar24 = (string *)((long)&psVar24->_M_string_length + 4);
      } while (lVar31 != 3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
      break;
    case 10:
      local_548 = 0;
      uStack_540 = 0;
      local_568.field_2._M_allocated_capacity = 0;
      local_568.field_2._8_8_ = 0;
      local_568._M_dataplus._M_p = (pointer)0x0;
      local_568._M_string_length = 0;
      psVar24 = &local_568;
      lVar31 = 0;
      puVar16 = local_3b8;
      psVar20 = psVar24;
      do {
        lVar27 = 0;
        do {
          *(undefined4 *)((long)&(psVar20->_M_dataplus)._M_p + lVar27 * 4) =
               *(undefined4 *)((long)puVar16 + lVar27);
          lVar27 = lVar27 + 4;
        } while (lVar27 != 0xc);
        lVar31 = lVar31 + 1;
        psVar20 = (string *)((long)&(psVar20->_M_dataplus)._M_p + 4);
        puVar16 = puVar16 + 3;
      } while (lVar31 != 4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"mat",3);
      poVar11 = (ostream *)std::ostream::operator<<(this_00,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"x",1);
      std::ostream::operator<<(poVar11,4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
      lVar31 = 0;
      uVar23 = extraout_RDX_08;
      do {
        lVar27 = 0;
        do {
          iVar9 = (int)uVar23;
          if ((int)lVar27 != 0 || (int)lVar31 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            iVar9 = extraout_EDX_02;
          }
          de::floatToString_abi_cxx11_
                    (&local_638,(de *)&DAT_00000001,
                     *(float *)((long)&(psVar24->_M_dataplus)._M_p + lVar27 * 4),iVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,local_638._M_dataplus._M_p,local_638._M_string_length);
          uVar23 = extraout_RDX_09;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_638._M_dataplus._M_p != &local_638.field_2) {
            operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
            uVar23 = extraout_RDX_10;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 != 4);
        lVar31 = lVar31 + 1;
        psVar24 = (string *)&psVar24->field_2;
      } while (lVar31 != 3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
      break;
    case 0xb:
      local_638.field_2._M_allocated_capacity = 0;
      local_638.field_2._8_8_ = 0;
      local_638._M_dataplus._M_p = (pointer)0x0;
      local_638._M_string_length = 0;
      lVar33 = 0;
      psVar24 = &local_638;
      bVar34 = true;
      do {
        bVar25 = bVar34;
        lVar31 = 0;
        do {
          *(undefined4 *)&(&psVar24->_M_dataplus)[lVar31]._M_p =
               *(undefined4 *)((long)local_3b0 + lVar31 * 4 + lVar33);
          lVar31 = lVar31 + 1;
        } while (lVar31 != 4);
        lVar33 = 0x10;
        psVar24 = (string *)((long)&local_638._M_dataplus._M_p + 4);
        bVar34 = false;
      } while (bVar25);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"mat",3);
      poVar11 = (ostream *)std::ostream::operator<<(this_00,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"x",1);
      std::ostream::operator<<(poVar11,2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
      lVar33 = 0;
      uVar23 = extraout_RDX_29;
      do {
        bVar5 = 0;
        lVar31 = 0;
        bVar34 = true;
        do {
          bVar25 = bVar34;
          iVar9 = (int)uVar23;
          if (!(bool)(lVar33 == 0 & (bVar5 ^ 1))) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            iVar9 = extraout_EDX_09;
          }
          de::floatToString_abi_cxx11_
                    (&local_568,(de *)&DAT_00000001,
                     *(float *)((long)(&local_638._M_dataplus + lVar33) + lVar31 * 4),iVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,local_568._M_dataplus._M_p,local_568._M_string_length);
          uVar23 = extraout_RDX_30;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_568._M_dataplus._M_p != &local_568.field_2) {
            operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
            uVar23 = extraout_RDX_31;
          }
          lVar31 = 1;
          bVar5 = 1;
          bVar34 = false;
        } while (bVar25);
        lVar33 = lVar33 + 1;
      } while (lVar33 != 4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
      lVar33 = local_5c8;
      break;
    case 0xc:
      local_548 = 0;
      uStack_540 = 0;
      local_568.field_2._M_allocated_capacity = 0;
      local_568.field_2._8_8_ = 0;
      local_568._M_dataplus._M_p = (pointer)0x0;
      local_568._M_string_length = 0;
      psVar24 = &local_568;
      lVar31 = 0;
      puVar16 = local_3a8;
      psVar20 = psVar24;
      do {
        lVar27 = 0;
        psVar28 = psVar20;
        do {
          *(undefined4 *)&(psVar28->_M_dataplus)._M_p = puVar16[lVar27];
          lVar27 = lVar27 + 1;
          psVar28 = (string *)((long)&psVar28->_M_string_length + 4);
        } while (lVar27 != 4);
        lVar31 = lVar31 + 1;
        psVar20 = (string *)((long)&(psVar20->_M_dataplus)._M_p + 4);
        puVar16 = puVar16 + 4;
      } while (lVar31 != 3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"mat",3);
      poVar11 = (ostream *)std::ostream::operator<<(this_00,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"x",1);
      std::ostream::operator<<(poVar11,3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
      lVar31 = 0;
      uVar23 = extraout_RDX;
      do {
        lVar27 = 0;
        do {
          iVar9 = (int)uVar23;
          if ((int)lVar27 != 0 || (int)lVar31 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            iVar9 = extraout_EDX;
          }
          de::floatToString_abi_cxx11_
                    (&local_638,(de *)&DAT_00000001,
                     *(float *)((long)&(psVar24->_M_dataplus)._M_p + lVar27 * 4),iVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,local_638._M_dataplus._M_p,local_638._M_string_length);
          uVar23 = extraout_RDX_00;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_638._M_dataplus._M_p != &local_638.field_2) {
            operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
            uVar23 = extraout_RDX_01;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 != 3);
        lVar31 = lVar31 + 1;
        psVar24 = (string *)((long)&psVar24->_M_string_length + 4);
      } while (lVar31 != 4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
      break;
    case 0xd:
      local_538 = 0;
      uStack_530 = 0;
      local_548 = 0;
      uStack_540 = 0;
      local_568.field_2._M_allocated_capacity = 0;
      local_568.field_2._8_8_ = 0;
      local_568._M_dataplus._M_p = (pointer)0x0;
      local_568._M_string_length = 0;
      psVar24 = &local_568;
      lVar31 = 0;
      puVar16 = local_3a0;
      psVar20 = psVar24;
      do {
        lVar27 = 0;
        do {
          *(undefined4 *)((long)&(psVar20->_M_dataplus)._M_p + lVar27 * 4) =
               *(undefined4 *)((long)puVar16 + lVar27);
          lVar27 = lVar27 + 4;
        } while (lVar27 != 0x10);
        lVar31 = lVar31 + 1;
        psVar20 = (string *)((long)&(psVar20->_M_dataplus)._M_p + 4);
        puVar16 = puVar16 + 4;
      } while (lVar31 != 4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"mat",3);
      std::ostream::operator<<(this_00,4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
      lVar31 = 0;
      uVar23 = extraout_RDX_05;
      do {
        lVar27 = 0;
        do {
          iVar9 = (int)uVar23;
          if ((int)lVar27 != 0 || (int)lVar31 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            iVar9 = extraout_EDX_01;
          }
          de::floatToString_abi_cxx11_
                    (&local_638,(de *)&DAT_00000001,
                     *(float *)((long)&(psVar24->_M_dataplus)._M_p + lVar27 * 4),iVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,local_638._M_dataplus._M_p,local_638._M_string_length);
          uVar23 = extraout_RDX_06;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_638._M_dataplus._M_p != &local_638.field_2) {
            operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
            uVar23 = extraout_RDX_07;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 != 4);
        lVar31 = lVar31 + 1;
        psVar24 = (string *)&psVar24->field_2;
      } while (lVar31 != 4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,";\n",2);
    local_5e8 = local_5d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"in","");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_568);
    std::ostream::operator<<(&local_568,(int)local_608);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_568);
    std::ios_base::~ios_base(local_4f8);
    uVar29 = 0xf;
    if (local_5e8 != local_5d8) {
      uVar29 = local_5d8[0];
    }
    if (uVar29 < (ulong)(local_5b0 + local_5e0)) {
      uVar29 = 0xf;
      if (local_5b8 != local_5a8) {
        uVar29 = local_5a8[0];
      }
      if (uVar29 < (ulong)(local_5b0 + local_5e0)) goto LAB_005af6c0;
      puVar13 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_5b8,0,(char *)0x0,(ulong)local_5e8);
    }
    else {
LAB_005af6c0:
      puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5e8,(ulong)local_5b8);
    }
    local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
    psVar19 = puVar13 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar19) {
      local_638.field_2._M_allocated_capacity = *psVar19;
      local_638.field_2._8_8_ = puVar13[3];
    }
    else {
      local_638.field_2._M_allocated_capacity = *psVar19;
      local_638._M_dataplus._M_p = (pointer)*puVar13;
    }
    local_638._M_string_length = puVar13[1];
    *puVar13 = psVar19;
    puVar13[1] = 0;
    *(undefined1 *)psVar19 = 0;
    std::__cxx11::string::operator=(local_590,(string *)&local_638);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_638._M_dataplus._M_p != &local_638.field_2) {
      operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
    }
    if (local_5b8 != local_5a8) {
      operator_delete(local_5b8,local_5a8[0] + 1);
    }
    if (local_5e8 != local_5d8) {
      operator_delete(local_5e8,local_5d8[0] + 1);
    }
LAB_005af78f:
    local_608 = (char *)((long)local_608 + 1);
    local_3a0 = local_3a0 + 0x10;
    local_3a8 = local_3a8 + 0xc;
    local_3b0 = local_3b0 + 8;
    local_3b8 = local_3b8 + 0xc;
    local_3c0 = local_3c0 + 9;
    local_3c8 = local_3c8 + 6;
    local_3d0 = local_3d0 + 6;
    local_398 = local_398 + 0x10;
    local_390 = local_390 + 0xc;
  } while (local_608 != (char *)lVar33);
  local_608 = ";\n";
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"\tgl_Position = a_position;\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  if ((local_610->super_ShaderRenderCase).m_isVertexCase == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tdEQP_FragColor = v_color;\n",0x1b);
  }
  else if (local_3e8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_3e8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar32 = local_3e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\tv_",3);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_320,(pbVar32->_M_dataplus)._M_p,
                           pbVar32->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," = ",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"a_",2);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,(pbVar32->_M_dataplus)._M_p,pbVar32->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,";\n",2);
      pbVar32 = pbVar32 + 1;
    } while (pbVar32 !=
             local_3e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_610->m_op - OP_PRE_INCREMENT < 4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t",1);
    pcVar10 = glu::getPrecisionName(local_5fc);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar12 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar10,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    pcVar10 = glu::getDataTypeName(local_63c);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar12 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar10,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," tmpValue = ",0xc);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,local_388,local_380);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,";\n",2);
    std::__cxx11::string::_M_replace((ulong)&local_588,0,local_580,0xb2016c);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_588);
  }
  psVar26 = (string *)&local_348;
  std::__cxx11::string::_M_assign(psVar26);
  OVar6 = MatrixCaseUtils::getOperationType(local_610->m_op);
  poVar11 = (ostream *)this_00;
  switch(OVar6) {
  case OPERATIONTYPE_BINARY_OPERATOR:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t",1);
    pcVar10 = glu::getPrecisionName(local_5fc);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar12 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar10,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    pcVar10 = glu::getDataTypeName(local_63c);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar12 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar10,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," res = ",7);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,local_588,(long)local_580);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
    pcVar10 = MatrixCaseUtils::getOperationName(local_610->m_op);
    sVar12 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar10,sVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
    break;
  case OPERATIONTYPE_BINARY_FUNCTION:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t",1);
    pcVar10 = glu::getPrecisionName(local_5fc);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar12 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar10,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    pcVar10 = glu::getDataTypeName(local_63c);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar12 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar10,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," res = ",7);
    pcVar10 = MatrixCaseUtils::getOperationName(local_610->m_op);
    sVar12 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar10,sVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,local_588,(long)local_580);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
    ppcVar17 = &local_348;
    goto LAB_005b027a;
  case OPERATIONTYPE_UNARY_PREFIX_OPERATOR:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t",1);
    pcVar10 = glu::getPrecisionName(local_5fc);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar12 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar10,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    pcVar10 = glu::getDataTypeName(local_63c);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar12 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar10,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," res = ",7);
    pcVar10 = MatrixCaseUtils::getOperationName(local_610->m_op);
    sVar12 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar10,sVar12);
    psVar26 = (string *)&local_588;
    break;
  case OPERATIONTYPE_UNARY_POSTFIX_OPERATOR:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t",1);
    pcVar10 = glu::getPrecisionName(local_5fc);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar12 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar10,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    pcVar10 = glu::getDataTypeName(local_63c);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar12 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar10,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," res = ",7);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,local_588,(long)local_580);
    pcVar10 = MatrixCaseUtils::getOperationName(local_610->m_op);
    sVar12 = strlen(pcVar10);
    lVar33 = 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar10,sVar12);
    goto LAB_005b0367;
  case OPERATIONTYPE_UNARY_FUNCTION:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t",1);
    pcVar10 = glu::getPrecisionName(local_5fc);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar12 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar10,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    pcVar10 = glu::getDataTypeName(local_63c);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar12 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar10,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," res = ",7);
    pcVar10 = MatrixCaseUtils::getOperationName(local_610->m_op);
    sVar12 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar10,sVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
    ppcVar17 = &local_588;
LAB_005b027a:
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,*ppcVar17,(long)ppcVar17[1]);
    lVar33 = 3;
    local_608 = ");\n";
    goto LAB_005b0367;
  case OPERATIONTYPE_ASSIGNMENT:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t",1);
    pcVar10 = glu::getPrecisionName(local_5fc);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar12 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar10,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    pcVar10 = glu::getDataTypeName(local_63c);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar12 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar10,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," res = ",7);
    poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,local_588,(long)local_580);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tres ",5);
    pcVar10 = MatrixCaseUtils::getOperationName(local_610->m_op);
    sVar12 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar10,sVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    break;
  default:
    goto switchD_005afc22_default;
  }
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,*(char **)psVar26,*(long *)(psVar26 + 8));
  lVar33 = 2;
LAB_005b0367:
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_608,lVar33);
switchD_005afc22_default:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t",1);
  pcVar10 = "dEQP_FragColor";
  bVar34 = (local_610->super_ShaderRenderCase).m_isVertexCase != false;
  if (bVar34) {
    pcVar10 = "v_color";
  }
  lVar33 = 0xe;
  if (bVar34) {
    lVar33 = 7;
  }
  pSVar21 = local_610;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar10,lVar33);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," = ",3);
  if (local_610->m_op - OP_PRE_INCREMENT < 4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"vec4(",5);
    sr::(anonymous_namespace)::ShaderMatrixCase::genGLSLMatToVec3Reduction_abi_cxx11_
              (&local_568,&local_63c,(DataType *)0xad5c40,(char *)pSVar21);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,local_568._M_dataplus._M_p,local_568._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,", 1.0) + vec4(",0xe);
    sr::(anonymous_namespace)::ShaderMatrixCase::genGLSLMatToVec3Reduction_abi_cxx11_
              (&local_638,&local_63c,(DataType *)"tmpValue",(char *)pSVar21);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,local_638._M_dataplus._M_p,local_638._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,", 0.0);\n",8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_638._M_dataplus._M_p != &local_638.field_2) {
      operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"vec4(",5);
    sr::(anonymous_namespace)::ShaderMatrixCase::genGLSLMatToVec3Reduction_abi_cxx11_
              (&local_568,&local_63c,(DataType *)0xad5c40,(char *)pSVar21);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,local_568._M_dataplus._M_p,local_568._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,", 1.0);\n",8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  pSVar21 = local_610;
  std::__cxx11::string::operator=
            ((string *)&(local_610->super_ShaderRenderCase).m_vertShaderSource,(string *)&local_568)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(pSVar21->super_ShaderRenderCase).m_fragShaderSource,(string *)&local_568);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
  }
  if (local_348 != &local_338) {
    operator_delete(local_348,CONCAT71(uStack_337,local_338) + 1);
  }
  if (local_588 != &local_578) {
    operator_delete(local_588,CONCAT71(uStack_577,local_578) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3e8);
  if (local_368 != &local_358) {
    operator_delete(local_368,CONCAT71(uStack_357,local_358) + 1);
  }
  if (local_388 != &local_378) {
    operator_delete(local_388,CONCAT71(uStack_377,local_378) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  return;
}

Assistant:

void ShaderMatrixCase::setupShader (void)
{
	std::ostringstream	vtx;
	std::ostringstream	frag;
	std::ostringstream&	op				= m_isVertexCase ? vtx : frag;

	bool				isInDynMat0		= isDataTypeMatrix(m_in0.dataType) && m_in0.inputType == INPUTTYPE_DYNAMIC;
	bool				isInDynMat1		= isDataTypeMatrix(m_in1.dataType) && m_in1.inputType == INPUTTYPE_DYNAMIC;
	string				inValue0;
	string				inValue1;
	DataType			resultType		= TYPE_LAST;
	Precision			resultPrec		= m_in0.precision;
	vector<string>		passVars;
	int					numInputs		= (isOperationBinary(m_op)) ? (2) : (1);

	std::string			operationValue0;
	std::string			operationValue1;

	DE_ASSERT(!isInDynMat0 || !isInDynMat1); // Only single dynamic matrix input is allowed.
	DE_UNREF(isInDynMat0 && isInDynMat1);

	// Compute result type.
	if (m_op == OP_MUL && isDataTypeMatrix(m_in0.dataType) && isDataTypeMatrix(m_in1.dataType))
	{
		resultType = getDataTypeMatrix(getDataTypeMatrixNumColumns(m_in1.dataType), getDataTypeMatrixNumRows(m_in0.dataType));
	}
	else if (m_op == OP_OUTER_PRODUCT)
	{
		resultType = getDataTypeMatrix(getDataTypeScalarSize(m_in1.dataType), getDataTypeScalarSize(m_in0.dataType));
	}
	else if (m_op == OP_TRANSPOSE)
	{
		resultType = getDataTypeMatrix(getDataTypeMatrixNumRows(m_in0.dataType), getDataTypeMatrixNumColumns(m_in0.dataType));
	}
	else if (m_op == OP_INVERSE)
	{
		resultType = m_in0.dataType;
	}
	else if (m_op == OP_DETERMINANT)
	{
		resultType = TYPE_FLOAT;
	}
	else if (getOperationType(m_op) == OPERATIONTYPE_UNARY_PREFIX_OPERATOR ||
			 getOperationType(m_op) == OPERATIONTYPE_UNARY_POSTFIX_OPERATOR)
	{
		resultType = m_in0.dataType;
	}
	else if (isDataTypeMatrix(m_in0.dataType) && isDataTypeMatrix(m_in1.dataType))
	{
		DE_ASSERT(m_in0.dataType == m_in1.dataType);
		resultType = m_in0.dataType;
	}
	else if (isDataTypeMatrix(m_in0.dataType) || isDataTypeMatrix(m_in1.dataType))
	{
		int			matNdx		= isDataTypeMatrix(m_in0.dataType) ? 0 : 1;
		DataType	matrixType	= matNdx == 0 ? m_in0.dataType : m_in1.dataType;
		DataType	otherType	= matNdx == 0 ? m_in1.dataType : m_in0.dataType;

		if (otherType == TYPE_FLOAT)
			resultType = matrixType;
		else
		{
			DE_ASSERT(isDataTypeVector(otherType));
			resultType = getDataTypeFloatVec(matNdx == 0 ? getDataTypeMatrixNumRows(matrixType) : getDataTypeMatrixNumColumns(matrixType));
		}
	}
	else
	{
		DE_ASSERT(DE_FALSE);
	}

	static const std::string header =
		"#version 310 es\n";

	vtx << header;
	frag << header;

	vtx << "layout(location = 0) in highp vec4 a_position;\n";
	frag << "layout(location = 0) out mediump vec4 dEQP_FragColor;\n";
	if (m_isVertexCase)
	{
		vtx << "layout(location = 0) out mediump vec4 v_color;\n";
		frag << "layout(location = 0) in mediump vec4 v_color;\n";
	}

	// Input declarations.
	deUint32 uniformBinding = 0;
	deUint32 padding = 0;
	for (int inNdx = 0; inNdx < numInputs; inNdx++)
	{
		const ShaderInput&	in			= inNdx > 0 ? m_in1 : m_in0;
		const char*			precName	= getPrecisionName(in.precision);
		const char*			typeName	= getDataTypeName(in.dataType);
		string&				inValue		= inNdx > 0 ? inValue1 : inValue0;

		if (in.inputType == INPUTTYPE_DYNAMIC)
		{
			if (isDataTypeMatrix(in.dataType))
			{
				vtx << "layout(location = " << 4 + inNdx + padding << ") in " << precName << " " << typeName << " a_";
				// a_matN, v_matN
				vtx << typeName << ";\n";
				if (!m_isVertexCase)
				{
					vtx << "layout(location = " << 1 + inNdx + padding << ") out " << precName << " " << typeName << " v_" << typeName << ";\n";
					frag << "layout(location = " << 1 + inNdx + padding << ") in " << precName << " " << typeName << " v_" << typeName << ";\n";
					passVars.push_back(typeName);
				}

				inValue = string(m_isVertexCase ? "a_" : "v_") + getDataTypeName(in.dataType);
				padding += getDataTypeMatrixNumColumns(in.dataType);
			}
			else
			{
				// a_coords, v_coords
				vtx << "layout(location = 1) in " << precName << " " << typeName << " a_coords;\n";
				if (!m_isVertexCase)
				{
					vtx << "layout(location = " << 1 + padding << ") out " << precName << " " << typeName << " v_coords;\n";
					frag << "layout(location = " << 1 + padding << ") in " << precName << " " << typeName << " v_coords;\n";
					passVars.push_back("coords");
				}

				inValue = m_isVertexCase ? "a_coords" : "v_coords";
			}
		}
		else if (in.inputType == INPUTTYPE_UNIFORM)
		{
			op << "layout(std140, set = 0, binding = " << uniformBinding++ <<  ") uniform buffer"<< inNdx <<" { " << precName << " " << typeName << " u_in" << inNdx << "; };\n";
			inValue = string("u_in") + de::toString(inNdx);
		}
		else if (in.inputType == INPUTTYPE_CONST)
		{
			op << "const " << precName << " " << typeName << " in" << inNdx << " = ";

			// Generate declaration.
			switch (in.dataType)
			{
				case TYPE_FLOAT:		op << de::floatToString(s_constInFloat[inNdx], 1);					break;
				case TYPE_FLOAT_VEC2:	writeVectorConstructor<2>(op, s_constInVec2[inNdx]);				break;
				case TYPE_FLOAT_VEC3:	writeVectorConstructor<3>(op, s_constInVec3[inNdx]);				break;
				case TYPE_FLOAT_VEC4:	writeVectorConstructor<4>(op, s_constInVec4[inNdx]);				break;
				case TYPE_FLOAT_MAT2:	writeMatrixConstructor<2, 2>(op, Mat2(s_constInMat2x2[inNdx]));		break;
				case TYPE_FLOAT_MAT2X3:	writeMatrixConstructor<2, 3>(op, Mat2x3(s_constInMat2x3[inNdx]));	break;
				case TYPE_FLOAT_MAT2X4:	writeMatrixConstructor<2, 4>(op, Mat2x4(s_constInMat2x4[inNdx]));	break;
				case TYPE_FLOAT_MAT3X2:	writeMatrixConstructor<3, 2>(op, Mat3x2(s_constInMat3x2[inNdx]));	break;
				case TYPE_FLOAT_MAT3:	writeMatrixConstructor<3, 3>(op, Mat3(s_constInMat3x3[inNdx]));		break;
				case TYPE_FLOAT_MAT3X4:	writeMatrixConstructor<3, 4>(op, Mat3x4(s_constInMat3x4[inNdx]));	break;
				case TYPE_FLOAT_MAT4X2:	writeMatrixConstructor<4, 2>(op, Mat4x2(s_constInMat4x2[inNdx]));	break;
				case TYPE_FLOAT_MAT4X3:	writeMatrixConstructor<4, 3>(op, Mat4x3(s_constInMat4x3[inNdx]));	break;
				case TYPE_FLOAT_MAT4:	writeMatrixConstructor<4, 4>(op, Mat4(s_constInMat4x4[inNdx]));		break;

				default:
					DE_ASSERT(DE_FALSE);
			}

			op << ";\n";

			inValue = string("in") + de::toString(inNdx);
		}
	}

	vtx << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	gl_Position = a_position;\n";
	frag << "\n"
		 << "void main (void)\n"
		 << "{\n";

	if (m_isVertexCase)
		frag << "	dEQP_FragColor = v_color;\n";
	else
	{
		for (vector<string>::const_iterator copyIter = passVars.begin(); copyIter != passVars.end(); copyIter++)
			vtx << "	v_" << *copyIter << " = " << "a_" << *copyIter << ";\n";
	}

	// Operation.

	switch (getOperationNature(m_op))
	{
		case OPERATIONNATURE_PURE:
			DE_ASSERT(getOperationType(m_op) != OPERATIONTYPE_ASSIGNMENT);

			operationValue0 = inValue0;
			operationValue1 = inValue1;
			break;

		case OPERATIONNATURE_MUTATING:
			DE_ASSERT(getOperationType(m_op) != OPERATIONTYPE_ASSIGNMENT);

			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " tmpValue = " << inValue0 << ";\n";

			operationValue0 = "tmpValue";
			operationValue1 = inValue1;
			break;

		case OPERATIONNATURE_ASSIGNMENT:
			DE_ASSERT(getOperationType(m_op) == OPERATIONTYPE_ASSIGNMENT);

			operationValue0 = inValue0;
			operationValue1 = inValue1;
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	switch (getOperationType(m_op))
	{
		case OPERATIONTYPE_BINARY_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << " " << getOperationName(m_op) << " " << operationValue1 << ";\n";
			break;

		case OPERATIONTYPE_UNARY_PREFIX_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << operationValue0 << ";\n";
			break;

		case OPERATIONTYPE_UNARY_POSTFIX_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << getOperationName(m_op) << ";\n";
			break;

		case OPERATIONTYPE_BINARY_FUNCTION:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << "(" << operationValue0 << ", " << operationValue1 << ");\n";
			break;

		case OPERATIONTYPE_UNARY_FUNCTION:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << "(" << operationValue0 << ");\n";
			break;

		case OPERATIONTYPE_ASSIGNMENT:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << ";\n";
			op << "	res " << getOperationName(m_op) << " " << operationValue1 << ";\n";
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	// Reduction to vec3 (rgb). Check the used value too if it was modified
	op << "	" << (m_isVertexCase ? "v_color" : "dEQP_FragColor") << " = ";

	if (isOperationValueModifying(m_op))
		op << "vec4(" << genGLSLMatToVec3Reduction(resultType, "res") << ", 1.0) + vec4(" << genGLSLMatToVec3Reduction(resultType, "tmpValue") << ", 0.0);\n";
	else
		op << "vec4(" << genGLSLMatToVec3Reduction(resultType, "res") << ", 1.0);\n";

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource	= vtx.str();
	m_fragShaderSource	= frag.str();
}